

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

DebuggerScope * __thiscall
Js::DebuggerScope::FindCommonAncestor(DebuggerScope *this,DebuggerScope *debuggerScope)

{
  code *pcVar1;
  bool bVar2;
  DebuggerScope *currentDebuggerScope;
  undefined4 *puVar3;
  DebuggerScope *pDVar4;
  DebuggerScope *pDVar5;
  int iVar6;
  int depth_1;
  int iVar7;
  int depth;
  int iVar8;
  int iVar9;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x17ee,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
LAB_00777a0d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDVar5 = debuggerScope;
  if (this != debuggerScope) {
    pDVar5 = this;
    pDVar4 = debuggerScope;
    if (debuggerScope == (DebuggerScope *)0x0) {
LAB_007778d6:
      while (pDVar5 != (DebuggerScope *)0x0) {
        pDVar5 = (pDVar5->parentScope).ptr;
        if (pDVar5 == debuggerScope) {
          return debuggerScope;
        }
      }
      iVar8 = 0;
      pDVar5 = this;
      do {
        pDVar5 = (pDVar5->parentScope).ptr;
        iVar8 = iVar8 + 1;
      } while (pDVar5 != (DebuggerScope *)0x0);
      iVar7 = 0;
      pDVar5 = debuggerScope;
      do {
        pDVar5 = (pDVar5->parentScope).ptr;
        iVar7 = iVar7 + 1;
      } while (pDVar5 != (DebuggerScope *)0x0);
      iVar6 = iVar8 - iVar7;
      iVar9 = -iVar6;
      if (0 < iVar6) {
        iVar9 = iVar6;
      }
      if (0 < iVar9) {
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        iVar9 = iVar7 - iVar8;
        if (iVar7 - iVar8 <= iVar6) {
          iVar9 = iVar6;
        }
        iVar9 = iVar9 + 1;
        do {
          pDVar5 = debuggerScope;
          if (iVar7 < iVar8) {
            pDVar5 = this;
          }
          if (pDVar5 == (DebuggerScope *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0x180c,"(nodeToBringUp)","nodeToBringUp");
            if (!bVar2) goto LAB_00777a0d;
            *puVar3 = 0;
          }
          pDVar5 = (pDVar5->parentScope).ptr;
          if (iVar8 <= iVar7) {
            debuggerScope = pDVar5;
            pDVar5 = this;
          }
          this = pDVar5;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
      }
      pDVar5 = (DebuggerScope *)0x0;
      if ((this != (DebuggerScope *)0x0) && (debuggerScope != (DebuggerScope *)0x0)) {
        pDVar5 = this;
        while ((pDVar5 != debuggerScope &&
               (pDVar4 = (pDVar5->parentScope).ptr, pDVar5 = (DebuggerScope *)0x0,
               pDVar4 != (DebuggerScope *)0x0))) {
          debuggerScope = (debuggerScope->parentScope).ptr;
          pDVar5 = pDVar4;
          if (debuggerScope == (DebuggerScope *)0x0) {
            return (DebuggerScope *)0x0;
          }
        }
      }
    }
    else {
      do {
        if (pDVar4 == (DebuggerScope *)0x0) goto LAB_007778d6;
        pDVar4 = (pDVar4->parentScope).ptr;
      } while (pDVar4 != this);
    }
  }
  return pDVar5;
}

Assistant:

DebuggerScope* DebuggerScope::FindCommonAncestor(DebuggerScope* debuggerScope)
    {
        AnalysisAssert(debuggerScope);

        if (this == debuggerScope)
        {
            return debuggerScope;
        }

        if (this->IsAncestorOf(debuggerScope))
        {
            return this;
        }

        if (debuggerScope->IsAncestorOf(this))
        {
            return debuggerScope;
        }

        DebuggerScope* firstNode = this;
        DebuggerScope* secondNode = debuggerScope;

        int firstDepth = firstNode->GetScopeDepth();
        int secondDepth = secondNode->GetScopeDepth();

        // Calculate the depth difference in order to bring the deep node up to the sibling
        // level of the shorter node.
        int depthDifference = abs(firstDepth - secondDepth);

        DebuggerScope*& nodeToBringUp = firstDepth > secondDepth ? firstNode : secondNode;
        while (depthDifference > 0)
        {
            AnalysisAssert(nodeToBringUp);
            nodeToBringUp = nodeToBringUp->GetParentScope();
            --depthDifference;
        }

        // Move up the tree and see where the nodes meet.
        while (firstNode && secondNode)
        {
            if (firstNode == secondNode)
            {
                return firstNode;
            }

            firstNode = firstNode->GetParentScope();
            secondNode = secondNode->GetParentScope();
        }

        // The nodes are not part of the same scope tree.
        return nullptr;
    }